

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_raw.c
# Opt level: O0

clnt_ops * clnt_raw_ops(void)

{
  pthread_mutex_lock((pthread_mutex_t *)&ops_lock);
  if (clnt_raw_ops::ops.cl_call == (_func_clnt_stat_clnt_req_ptr *)0x0) {
    clnt_raw_ops::ops.cl_call = clnt_raw_call;
    clnt_raw_ops::ops.cl_abort = clnt_raw_abort;
    clnt_raw_ops::ops.cl_freeres = clnt_raw_freeres;
    clnt_raw_ops::ops.cl_destroy = clnt_raw_destroy;
    clnt_raw_ops::ops.cl_control = clnt_raw_control;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&ops_lock);
  return &clnt_raw_ops::ops;
}

Assistant:

static struct clnt_ops *
clnt_raw_ops(void)
{
	static struct clnt_ops ops;
	extern mutex_t ops_lock; /* XXXX does it need to be extern? */

	/* VARIABLES PROTECTED BY ops_lock: ops */

	mutex_lock(&ops_lock);
	if (ops.cl_call == NULL) {
		ops.cl_call = clnt_raw_call;
		ops.cl_abort = clnt_raw_abort;
		ops.cl_freeres = clnt_raw_freeres;
		ops.cl_destroy = clnt_raw_destroy;
		ops.cl_control = clnt_raw_control;
	}
	mutex_unlock(&ops_lock);
	return (&ops);
}